

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O2

string * __thiscall
soul::TokenisedPathString::getParentPath_abi_cxx11_
          (string *__return_storage_ptr__,TokenisedPathString *this)

{
  ulong uVar1;
  string sStack_38;
  
  uVar1 = (this->sections).numActive;
  if (uVar1 < 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::operator[]
              (&this->sections,uVar1 - 2);
    std::__cxx11::string::substr((ulong)&sStack_38,(ulong)this);
    choc::text::trim(__return_storage_ptr__,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getParentPath() const
    {
        if (sections.size() <= 1)
            return {};

        return choc::text::trim (fullPath.substr (0, sections[sections.size() - 2].end));
    }